

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O2

void __thiscall gui::TextBoxStyle::~TextBoxStyle(TextBoxStyle *this)

{
  ~TextBoxStyle(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~TextBoxStyle() = default;